

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

uint Abc_NtkDelayTraceTCEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float tDelta,int fUseLutLib)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  float fVar4;
  float fVar5;
  void *local_158;
  int local_14c;
  int k;
  float *pDelays;
  float tRequired;
  uint uResult;
  Abc_Obj_t *pFanin;
  If_LibLut_t *pLutLib;
  float pPinDelays [32];
  int pPinPerm [32];
  int fUseLutLib_local;
  float tDelta_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtk_local;
  
  pDelays._4_4_ = 0;
  if (fUseLutLib == 0) {
    local_158 = (void *)0x0;
  }
  else {
    local_158 = Abc_FrameReadLibLut();
  }
  fVar4 = Abc_ObjRequired(pNode);
  if (local_158 == (void *)0x0) {
    for (local_14c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_14c < iVar1; local_14c = local_14c + 1
        ) {
      pAVar3 = Abc_ObjFanin(pNode,local_14c);
      fVar5 = Abc_ObjArrival(pAVar3);
      if (fVar4 < fVar5 + 1.0 + tDelta) {
        pDelays._4_4_ = 1 << ((byte)local_14c & 0x1f) | pDelays._4_4_;
      }
    }
  }
  else if (*(int *)((long)local_158 + 0xc) == 0) {
    iVar1 = Abc_ObjFaninNum(pNode);
    for (local_14c = 0; iVar2 = Abc_ObjFaninNum(pNode), local_14c < iVar2; local_14c = local_14c + 1
        ) {
      pAVar3 = Abc_ObjFanin(pNode,local_14c);
      fVar5 = Abc_ObjArrival(pAVar3);
      if (fVar4 < fVar5 + *(float *)((long)local_158 + (long)iVar1 * 0x84 + 0x94) + tDelta) {
        pDelays._4_4_ = 1 << ((byte)local_14c & 0x1f) | pDelays._4_4_;
      }
    }
  }
  else {
    iVar1 = Abc_ObjFaninNum(pNode);
    Abc_NtkDelayTraceSortPins(pNode,(int *)(pPinDelays + 0x1e),(float *)&pLutLib);
    for (local_14c = 0; iVar2 = Abc_ObjFaninNum(pNode), local_14c < iVar2; local_14c = local_14c + 1
        ) {
      Abc_ObjFanin(pNode,local_14c);
      pAVar3 = Abc_ObjFanin(pNode,(int)pPinDelays[(long)local_14c + 0x1e]);
      fVar5 = Abc_ObjArrival(pAVar3);
      if (fVar4 < fVar5 + *(float *)((long)local_158 +
                                    (long)local_14c * 4 + (long)iVar1 * 0x84 + 0x94) + tDelta) {
        pDelays._4_4_ = 1 << (SUB41(pPinDelays[(long)local_14c + 0x1e],0) & 0x1f) | pDelays._4_4_;
      }
    }
  }
  return pDelays._4_4_;
}

Assistant:

unsigned Abc_NtkDelayTraceTCEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float tDelta, int fUseLutLib )
{
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pFanin;
    unsigned uResult = 0;
    float tRequired, * pDelays;
    int k;
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    tRequired = Abc_ObjRequired(pNode);
    if ( pLutLib == NULL )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(pFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
        Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( tRequired < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}